

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

string * __thiscall
BasePort::GetFpgaVersionMajorString_abi_cxx11_
          (string *__return_storage_ptr__,BasePort *this,uchar boardId)

{
  uint uVar1;
  
  if (boardId < 0x10) {
    uVar1 = this->FpgaVersion[boardId];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"FPGA_V","");
    if (uVar1 != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"FPGA_V","");
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::GetFpgaVersionMajorString(unsigned char boardId) const
{
    unsigned int fpga_ver = GetFpgaVersionMajor(boardId);
    std::string fStr("FPGA_V");
    if (fpga_ver == 0)
        fStr.push_back('?');
    else
        fStr.push_back('0'+fpga_ver);
    return fStr;
}